

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O3

bool __thiscall TTD::SnapShot::AllWellKnownObjectsReusable(SnapShot *this,InflateMap *inflator)

{
  bool bVar1;
  RecyclableObject *obj;
  DynamicObject *dynObj;
  SnapObject *pSVar2;
  UnorderedArrayListLink *pUVar3;
  SnapObject *snpObj;
  SnapObject *snpObject;
  
  pSVar2 = (this->m_compoundObjectList).m_inlineHeadBlock.CurrPos;
  snpObject = (this->m_compoundObjectList).m_inlineHeadBlock.BlockData;
  if (snpObject != (SnapObject *)0x0 && snpObject != pSVar2) {
    pUVar3 = (this->m_compoundObjectList).m_inlineHeadBlock.Next;
    do {
      if (snpObject->OptWellKnownToken != (TTD_WELLKNOWN_TOKEN)0x0) {
        obj = InflateMap::FindReusableObject_WellKnowReuseCheck(inflator,snpObject->ObjectPtrId);
        dynObj = Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
        bVar1 = NSSnapObjects::DoesObjectBlockScriptContextReuse(snpObject,dynObj,inflator);
        if (bVar1) {
          return false;
        }
      }
      snpObject = snpObject + 1;
      if (snpObject == pSVar2) {
        if (pUVar3 == (UnorderedArrayListLink *)0x0) {
          return true;
        }
        pSVar2 = pUVar3->CurrPos;
        snpObject = pUVar3->BlockData;
        pUVar3 = pUVar3->Next;
      }
    } while (snpObject != (SnapObject *)0x0);
  }
  return true;
}

Assistant:

bool SnapShot::AllWellKnownObjectsReusable(InflateMap* inflator) const
    {
        for(auto iter = this->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapObjects::SnapObject* snpObj = iter.Current();
            if(snpObj->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN)
            {
                Js::RecyclableObject* rObj = inflator->FindReusableObject_WellKnowReuseCheck(snpObj->ObjectPtrId);
                bool blocking = NSSnapObjects::DoesObjectBlockScriptContextReuse(snpObj, Js::VarTo<Js::DynamicObject>(rObj), inflator);

                if(blocking)
                {
                    return false;
                }
            }
        }

        return true;
    }